

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O2

void secp256k1_dleq_serialize_point(uchar *buf33,secp256k1_ge *p)

{
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_48.n[4] = (p->x).n[4];
  local_48.n[0] = (p->x).n[0];
  local_48.n[1] = (p->x).n[1];
  local_48.n[2] = (p->x).n[2];
  local_48.n[3] = (p->x).n[3];
  local_78.n[4] = (p->y).n[4];
  local_78.n[0] = (p->y).n[0];
  local_78.n[1] = (p->y).n[1];
  local_78.n[2] = (p->y).n[2];
  local_78.n[3] = (p->y).n[3];
  secp256k1_fe_normalize(&local_78);
  *buf33 = (byte)local_78.n[0] & 1;
  secp256k1_fe_normalize(&local_48);
  secp256k1_fe_get_b32(buf33 + 1,&local_48);
  return;
}

Assistant:

static void secp256k1_dleq_serialize_point(unsigned char *buf33, const secp256k1_ge *p) {
    secp256k1_fe x = p->x;
    secp256k1_fe y = p->y;

    secp256k1_fe_normalize(&y);
    buf33[0] = secp256k1_fe_is_odd(&y);
    secp256k1_fe_normalize(&x);
    secp256k1_fe_get_b32(&buf33[1], &x);
}